

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,EnumDescriptor *descriptor,
          bool immutable)

{
  byte bVar1;
  bool multiple_files;
  FileDescriptor *file;
  FileDescriptor *descriptor_00;
  string local_48;
  byte local_21;
  EnumDescriptor *pEStack_20;
  bool immutable_local;
  EnumDescriptor *descriptor_local;
  ClassNameResolver *this_local;
  
  local_21 = immutable;
  pEStack_20 = descriptor;
  descriptor_local = (EnumDescriptor *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  (anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)descriptor,(EnumDescriptor *)(ulong)(immutable & 1),
             SUB81(__return_storage_ptr__,0));
  file = EnumDescriptor::file(pEStack_20);
  bVar1 = local_21;
  descriptor_00 = EnumDescriptor::file(pEStack_20);
  multiple_files = MultipleJavaFiles(descriptor_00,(bool)(local_21 & 1));
  GetClassFullName(__return_storage_ptr__,this,&local_48,file,(bool)(bVar1 & 1),multiple_files);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string ClassNameResolver::GetClassName(const EnumDescriptor* descriptor,
                                       bool immutable) {
  return GetClassFullName(ClassNameWithoutPackage(descriptor, immutable),
                          descriptor->file(), immutable,
                          MultipleJavaFiles(descriptor->file(), immutable));
}